

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_CfdSetIssueTest_Test::TestBody
          (cfdcapi_elements_transaction_CfdSetIssueTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  long *expected_predicate_value;
  void **in_stack_000000c8;
  char *in_stack_000000d0;
  uint32_t in_stack_000000dc;
  uint32_t in_stack_000000e0;
  int in_stack_000000e4;
  void *in_stack_000000e8;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  char *str_buffer;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  char *token_string;
  char *asset_string;
  char *entropy;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  void *create_handle;
  char *tx_string;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  char *exp_tx;
  char *base_tx;
  undefined1 in_stack_00000b7f;
  int64_t in_stack_00000b80;
  char *in_stack_00000b88;
  uint32_t in_stack_00000b94;
  char *in_stack_00000b98;
  void *in_stack_00000ba0;
  void *in_stack_00000ba8;
  char *in_stack_00000bc0;
  char *in_stack_00000bc8;
  int64_t in_stack_00000bd0;
  char *in_stack_00000bd8;
  char *in_stack_00000be0;
  char **in_stack_00000bf0;
  char **in_stack_00000bf8;
  char **in_stack_00000c00;
  char *in_stack_fffffffffffffbf8;
  AssertionResult *in_stack_fffffffffffffc00;
  CfdErrorCode *in_stack_fffffffffffffc08;
  char *in_stack_fffffffffffffc10;
  void **in_stack_fffffffffffffc18;
  char **in_stack_fffffffffffffc38;
  char **in_stack_fffffffffffffc90;
  AssertionResult *in_stack_fffffffffffffc98;
  AssertHelper local_288;
  Message local_280;
  undefined4 local_274;
  AssertionResult local_270;
  AssertHelper local_260;
  Message local_258;
  AssertionResult local_250;
  AssertHelper local_240;
  Message local_238;
  undefined4 local_22c;
  AssertionResult local_228;
  char *local_218;
  AssertHelper local_210;
  Message local_208;
  AssertionResult local_200;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined4 local_1dc;
  AssertionResult local_1d8;
  AssertHelper local_1c8;
  Message local_1c0;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  AssertionResult local_198;
  AssertHelper local_188;
  Message local_180;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  AssertionResult local_150;
  char *local_140;
  char *local_138;
  char *local_130;
  string local_128;
  AssertHelper local_108;
  Message local_100;
  undefined1 local_f1;
  AssertionResult local_f0;
  AssertHelper local_e0;
  Message local_d8;
  undefined4 local_cc;
  AssertionResult local_c8;
  long local_b8;
  char *local_b0;
  string local_a8;
  AssertHelper local_88;
  Message local_80;
  undefined1 local_71;
  AssertionResult local_70;
  AssertHelper local_60;
  Message local_58 [3];
  undefined4 local_3c;
  AssertionResult local_38;
  int local_24;
  long local_20;
  char *local_18;
  char *local_10;
  
  local_10 = 
  "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000"
  ;
  local_18 = 
  "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00040135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000002540be400001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec0501000000003b9aca00001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb539077000000000000000000"
  ;
  local_20 = 0;
  local_24 = CfdCreateHandle(in_stack_fffffffffffffc18);
  local_3c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
             (int *)in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36d288);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x860,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message((Message *)0x36d2eb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36d340);
  local_71 = local_20 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc00,(bool *)in_stack_fffffffffffffbf8,(type *)0x36d374);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_70,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x861,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message((Message *)0x36d470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36d4eb);
  local_b0 = (char *)0x0;
  local_b8 = 0;
  expected_predicate_value = &local_b8;
  local_24 = CfdInitializeTransaction
                       (in_stack_000000e8,in_stack_000000e4,in_stack_000000e0,in_stack_000000dc,
                        in_stack_000000d0,in_stack_000000c8);
  local_cc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
             (int *)in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36d5e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x868,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message((Message *)0x36d643);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36d698);
  local_f1 = local_b8 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc00,(bool *)in_stack_fffffffffffffbf8,(type *)0x36d6cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)&local_f0,(AssertionResult *)"(NULL == create_handle)","true",
               "false",(char *)expected_predicate_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x869,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    testing::Message::~Message((Message *)0x36d7c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36d843);
  if (local_24 == 0) {
    local_130 = (char *)0x0;
    local_138 = (char *)0x0;
    local_140 = (char *)0x0;
    in_stack_fffffffffffffc38 = &local_140;
    in_stack_fffffffffffffc10 = "2dqLgUheB1R4gw7G2DKuxBeMr1jdgxECAoG";
    in_stack_fffffffffffffbf8 = "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z";
    in_stack_fffffffffffffc18 = (void **)0x0;
    in_stack_fffffffffffffc08 = (CfdErrorCode *)0x3b9aca00;
    in_stack_fffffffffffffc00 = (AssertionResult *)0x0;
    local_24 = CfdSetIssueAsset(in_stack_00000ba8,in_stack_00000ba0,in_stack_00000b98,
                                in_stack_00000b94,in_stack_00000b88,in_stack_00000b80,
                                in_stack_00000bc0,in_stack_00000bc8,in_stack_00000bd0,
                                in_stack_00000bd8,in_stack_00000be0,(bool)in_stack_00000b7f,
                                in_stack_00000bf0,in_stack_00000bf8,in_stack_00000c00);
    local_154 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08
               ,(int *)in_stack_fffffffffffffc00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
    if (!bVar1) {
      testing::Message::Message(&local_160);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36d9bc);
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x874,pcVar2);
      testing::internal::AssertHelper::operator=(&local_168,&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      testing::Message::~Message((Message *)0x36da1f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36da74);
    if (local_24 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_178,
                 "\"0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70\"","entropy",
                 "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70",local_130);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
      if (!bVar1) {
        testing::Message::Message(&local_180);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36db23);
        testing::internal::AssertHelper::AssertHelper
                  (&local_188,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x876,pcVar2);
        testing::internal::AssertHelper::operator=(&local_188,&local_180);
        testing::internal::AssertHelper::~AssertHelper(&local_188);
        testing::Message::~Message((Message *)0x36db86);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36dbdb);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_198,
                 "\"dc819012d9b1cb9af5c87f2898e545ee4ceaf5d1ccd5141807897d02c71eec07\"",
                 "asset_string","dc819012d9b1cb9af5c87f2898e545ee4ceaf5d1ccd5141807897d02c71eec07",
                 local_138);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_198);
      if (!bVar1) {
        testing::Message::Message(&local_1a0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36dc7c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x877,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        testing::Message::~Message((Message *)0x36dcdf);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36dd34);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1b8,
                 "\"05ec32e1162a2b3ba2d2e5b9c5f46471b3a275f84e5b6006d49774849c57f1aa\"",
                 "token_string","05ec32e1162a2b3ba2d2e5b9c5f46471b3a275f84e5b6006d49774849c57f1aa",
                 local_140);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
      if (!bVar1) {
        testing::Message::Message(&local_1c0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36ddd5);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x878,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
        testing::internal::AssertHelper::~AssertHelper(&local_1c8);
        testing::Message::~Message((Message *)0x36de38);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36de8d);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc08);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc08);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc08);
    }
  }
  if (local_24 == 0) {
    local_24 = CfdFinalizeTransaction
                         (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,(char **)0x36def5);
    local_1dc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08
               ,(int *)in_stack_fffffffffffffc00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
    if (!bVar1) {
      testing::Message::Message(&local_1e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36df97);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x881,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1f0);
      testing::Message::~Message((Message *)0x36dffa);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36e04f);
    if (local_24 == 0) {
      in_stack_fffffffffffffc98 = &local_200;
      testing::internal::CmpHelperSTREQ
                ((internal *)in_stack_fffffffffffffc98,"exp_tx","tx_string",local_18,local_b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc98);
      if (!bVar1) {
        testing::Message::Message(&local_208);
        in_stack_fffffffffffffc90 =
             (char **)testing::AssertionResult::failure_message((AssertionResult *)0x36e0ff);
        testing::internal::AssertHelper::AssertHelper
                  (&local_210,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x883,(char *)in_stack_fffffffffffffc90);
        testing::internal::AssertHelper::operator=(&local_210,&local_208);
        testing::internal::AssertHelper::~AssertHelper(&local_210);
        testing::Message::~Message((Message *)0x36e162);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36e1b7);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc08);
    }
  }
  CfdFreeTransactionHandle(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  local_24 = CfdGetLastErrorCode(in_stack_fffffffffffffc38);
  if (local_24 != 0) {
    local_218 = (char *)0x0;
    local_24 = CfdGetLastErrorMessage(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    local_22c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08
               ,(int *)in_stack_fffffffffffffc00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
    if (!bVar1) {
      testing::Message::Message(&local_238);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36e2d4);
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x88e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      testing::Message::~Message((Message *)0x36e337);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36e38c);
    testing::internal::CmpHelperSTREQ((internal *)&local_250,"\"\"","str_buffer","",local_218);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_250);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36e421);
      testing::internal::AssertHelper::AssertHelper
                (&local_260,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x88f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_260,&local_258);
      testing::internal::AssertHelper::~AssertHelper(&local_260);
      testing::Message::~Message((Message *)0x36e47e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36e4d3);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffc08);
    local_218 = (char *)0x0;
  }
  local_24 = CfdFreeHandle(in_stack_fffffffffffffc08);
  local_274 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
             (int *)in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x36e5a3);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x895,pcVar2);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    testing::Message::~Message((Message *)0x36e600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36e655);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, CfdSetIssueTest) {
  const char* base_tx = "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000";
  const char* exp_tx = "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00040135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000002540be400001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec0501000000003b9aca00001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb539077000000000000000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* tx_string = nullptr;

  void* create_handle = nullptr;
  ret = CfdInitializeTransaction(handle, kCfdNetworkLiquidv1, 2, 0,
      base_tx, &create_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == create_handle));
  if (ret == kCfdSuccess) {
    char* entropy = nullptr;
    char* asset_string = nullptr;
    char* token_string = nullptr;
    ret = CfdSetIssueAsset(
        handle, create_handle,
        "c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f", 1,
        nullptr, 10000000000, "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z",
        nullptr, 1000000000, "2dqLgUheB1R4gw7G2DKuxBeMr1jdgxECAoG", nullptr,
        false, &entropy, &asset_string, &token_string);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70", entropy);
      EXPECT_STREQ("dc819012d9b1cb9af5c87f2898e545ee4ceaf5d1ccd5141807897d02c71eec07", asset_string);
      EXPECT_STREQ("05ec32e1162a2b3ba2d2e5b9c5f46471b3a275f84e5b6006d49774849c57f1aa", token_string);
      CfdFreeStringBuffer(entropy);
      CfdFreeStringBuffer(asset_string);
      CfdFreeStringBuffer(token_string);
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdFinalizeTransaction(handle, create_handle, &tx_string);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_tx, tx_string);
      CfdFreeStringBuffer(tx_string);
    }
  }

  CfdFreeTransactionHandle(handle, create_handle);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}